

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,BranchInst *br,bool param_2)

{
  Value *pVVar1;
  BasicBlock *bb;
  BasicBlock *local_38;
  BasicBlock *local_30;
  Value *local_28;
  undefined1 local_19;
  BranchInst *pBStack_18;
  bool param_2_local;
  BranchInst *br_local;
  StreamState *this_local;
  
  local_19 = param_2;
  pBStack_18 = br;
  br_local = (BranchInst *)this;
  append(this,"br ");
  pVVar1 = BranchInst::getCondition(pBStack_18);
  if (pVVar1 == (Value *)0x0) {
    bb = BranchInst::getSuccessor(pBStack_18,0);
    append(this,bb,false);
  }
  else {
    local_28 = BranchInst::getCondition(pBStack_18);
    local_30 = BranchInst::getSuccessor(pBStack_18,0);
    local_38 = BranchInst::getSuccessor(pBStack_18,1);
    append<LLVMBC::Value*,char_const(&)[3],LLVMBC::BasicBlock*,char_const(&)[3],LLVMBC::BasicBlock*>
              (this,&local_28,(char (*) [3])", ",&local_30,(char (*) [3])", ",&local_38);
  }
  return;
}

Assistant:

void StreamState::append(BranchInst *br, bool)
{
	append("br ");
	if (br->getCondition())
		append(br->getCondition(), ", ", br->getSuccessor(0), ", ", br->getSuccessor(1));
	else
		append(br->getSuccessor(0));
}